

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_error.hpp
# Opt level: O1

string * __thiscall
jsoncons::cbor::cbor_error_category_impl::message_abi_cxx11_
          (string *__return_storage_ptr__,cbor_error_category_impl *this,int ev)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(ev) {
  case 1:
    pcVar2 = "Unexpected end of file";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Source error";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Invalid decimal fraction";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Invalid bigfloat";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Illegal UTF-8 encoding in text string";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "Too many items were added to a CBOR map or array of known length";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Too few items were added to a CBOR map or array of known length";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "Number exceeds implementation limits";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "stringref exceeds stringref map size";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "Data item nesting exceeds limit in options";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "An unknown type was found in the stream";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "An illegal type was found while parsing an indefinite length string";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown CBOR parser error";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const override
    {
        switch (static_cast<cbor_errc>(ev))
        {
            case cbor_errc::unexpected_eof:
                return "Unexpected end of file";
            case cbor_errc::source_error:
                return "Source error";
            case cbor_errc::invalid_decimal_fraction:
                return "Invalid decimal fraction";
            case cbor_errc::invalid_bigfloat:
                return "Invalid bigfloat";
            case cbor_errc::invalid_utf8_text_string:
                return "Illegal UTF-8 encoding in text string";
            case cbor_errc::too_many_items:
                return "Too many items were added to a CBOR map or array of known length";
            case cbor_errc::too_few_items:
                return "Too few items were added to a CBOR map or array of known length";
            case cbor_errc::number_too_large:
                return "Number exceeds implementation limits";
            case cbor_errc::stringref_too_large:
                return "stringref exceeds stringref map size";
            case cbor_errc::max_nesting_depth_exceeded:
                return "Data item nesting exceeds limit in options";
            case cbor_errc::unknown_type:
                return "An unknown type was found in the stream";
            case cbor_errc::illegal_chunked_string:
                return "An illegal type was found while parsing an indefinite length string";
            default:
                return "Unknown CBOR parser error";
        }
    }